

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

int64_t __thiscall
wallet::CWallet::RescanFromTime
          (CWallet *this,int64_t startTime,WalletRescanReserver *reserver,bool update)

{
  int iVar1;
  Chain *pCVar2;
  long in_FS_OFFSET;
  int64_t time_max;
  int start_height;
  ScanResult result;
  uint256 start_block;
  bool local_109;
  long local_108;
  int local_fc;
  undefined1 local_f8 [8];
  int *piStack_f0;
  undefined8 local_e8;
  long *plStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ScanResult local_a4;
  __native_type local_58;
  
  local_58.__data.__list.__next = (__pthread_internal_list *)*(long *)(in_FS_OFFSET + 0x28);
  local_fc = 0;
  local_58._16_8_ = 0;
  local_58.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_58.__align = 0;
  local_58._8_8_ = 0;
  pCVar2 = chain(this);
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  plStack_e0 = (long *)0x0;
  local_f8 = (undefined1  [8])&local_58;
  piStack_f0 = &local_fc;
  iVar1 = (*pCVar2->_vptr_Chain[0xb])(pCVar2,startTime + -0x1c20,0);
  if ((char)iVar1 == '\0') {
    local_a4.status = SUCCESS;
    WalletLogPrintf<char[15],int>
              (this,(ConstevalFormatString<2U>)0xe06950,(char (*) [15])"RescanFromTime",
               (int *)&local_a4);
  }
  else {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_f8,&this->cs_wallet,
               "cs_wallet",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
               ,0x730,false);
    iVar1 = GetLastBlockHeight(this);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)local_f8);
    local_a4.status = (iVar1 - local_fc) + FAILURE;
    WalletLogPrintf<char[15],int>
              (this,(ConstevalFormatString<2U>)0xe06950,(char (*) [15])"RescanFromTime",
               (int *)&local_a4);
    ScanForWalletTransactions
              (&local_a4,this,(uint256 *)&local_58.__data,local_fc,(optional<int>)0x0,reserver,
               update,false);
    if (local_a4.status == FAILURE) {
      pCVar2 = chain(this);
      local_e8 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_f8 = (undefined1  [8])0x0;
      piStack_f0 = (int *)0x0;
      plStack_e0 = &local_108;
      iVar1 = (*pCVar2->_vptr_Chain[10])(pCVar2,&local_a4.last_failed_block);
      local_109 = SUB41(iVar1,0);
      inline_check_non_fatal<bool>
                (&local_109,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                 ,0x737,"RescanFromTime",
                 "chain().findBlock(result.last_failed_block, FoundBlock().maxTime(time_max))");
      startTime = local_108 + 0x1c21;
    }
  }
  if (*(__pthread_internal_list **)(in_FS_OFFSET + 0x28) == local_58.__data.__list.__next) {
    return startTime;
  }
  __stack_chk_fail();
}

Assistant:

int64_t CWallet::RescanFromTime(int64_t startTime, const WalletRescanReserver& reserver, bool update)
{
    // Find starting block. May be null if nCreateTime is greater than the
    // highest blockchain timestamp, in which case there is nothing that needs
    // to be scanned.
    int start_height = 0;
    uint256 start_block;
    bool start = chain().findFirstBlockWithTimeAndHeight(startTime - TIMESTAMP_WINDOW, 0, FoundBlock().hash(start_block).height(start_height));
    WalletLogPrintf("%s: Rescanning last %i blocks\n", __func__, start ? WITH_LOCK(cs_wallet, return GetLastBlockHeight()) - start_height + 1 : 0);

    if (start) {
        // TODO: this should take into account failure by ScanResult::USER_ABORT
        ScanResult result = ScanForWalletTransactions(start_block, start_height, /*max_height=*/{}, reserver, /*fUpdate=*/update, /*save_progress=*/false);
        if (result.status == ScanResult::FAILURE) {
            int64_t time_max;
            CHECK_NONFATAL(chain().findBlock(result.last_failed_block, FoundBlock().maxTime(time_max)));
            return time_max + TIMESTAMP_WINDOW + 1;
        }
    }
    return startTime;
}